

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFileValExist(int count,char **names)

{
  bool_t bVar1;
  file_t file;
  long lVar2;
  
  if (count == 0) {
    return 0;
  }
  lVar2 = 0;
  while( true ) {
    file = fileOpen(names[lVar2],"rb");
    if (file == (file_t)0x0) {
      return 0xca;
    }
    bVar1 = fileClose(file);
    if (bVar1 == 0) break;
    lVar2 = lVar2 + 1;
    if (count == (int)lVar2) {
      return 0;
    }
  }
  return 0x67;
}

Assistant:

err_t cmdFileValExist(int count, char* names[])
{
	err_t code;
	file_t file;
	for (; count--; names++)
	{
		ASSERT(strIsValid(*names));
		code = cmdFileOpen(file, *names, "rb");
		if (code != ERR_OK)
			return ERR_FILE_NOT_FOUND;
		code = cmdFileClose(file);
		ERR_CALL_CHECK(code);
	}
	return ERR_OK;
}